

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

Float __thiscall pbrt::Curve::Area(Curve *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  span<const_pbrt::Point3<float>_> cp;
  array<pbrt::Point3<float>,_4> cpObj;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  ulong uStack_40;
  array<pbrt::Point3<float>,_4> local_38;
  
  cp.ptr = this->common->cpObj;
  cp.n = 4;
  CubicBezierControlPoints(&local_38,cp,this->uMin,this->uMax);
  _local_48 = ZEXT416((uint)this->common->width[0]);
  local_58 = ZEXT416((uint)this->common->width[1]);
  uVar1._0_4_ = this->uMin;
  uVar1._4_4_ = this->uMax;
  lVar3 = 0x14;
  fVar11 = 0.0;
  do {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)(local_58 + lVar3 + 0xc);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)(local_48 + lVar3 + 8);
    auVar5 = vsubps_avx(auVar5,auVar8);
    auVar6._0_4_ = auVar5._0_4_ * auVar5._0_4_;
    auVar6._4_4_ = auVar5._4_4_ * auVar5._4_4_;
    auVar6._8_4_ = auVar5._8_4_ * auVar5._8_4_;
    auVar6._12_4_ = auVar5._12_4_ * auVar5._12_4_;
    auVar5 = vhaddps_avx(auVar6,auVar6);
    fVar4 = *(float *)(local_48 + lVar3 + 4) -
            *(float *)((long)&local_38.values[0].super_Tuple3<pbrt::Point3,_float>.x + lVar3);
    fVar4 = auVar5._0_4_ + fVar4 * fVar4;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      auVar5 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
      fVar4 = auVar5._0_4_;
    }
    fVar11 = fVar11 + fVar4;
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0x38);
  auVar7._8_4_ = 0x3f800000;
  auVar7._0_8_ = 0x3f8000003f800000;
  auVar7._12_4_ = 0x3f800000;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  auVar5 = vsubps_avx(auVar7,auVar2);
  auVar9._0_4_ = (float)local_58._0_4_ * (float)(undefined4)uVar1;
  auVar9._4_4_ = (float)local_58._0_4_ * (float)uVar1._4_4_;
  auVar9._8_4_ = (float)local_58._0_4_ * 0.0;
  auVar9._12_4_ = (float)local_58._0_4_ * 0.0;
  auVar10._4_4_ = local_48._0_4_;
  auVar10._0_4_ = local_48._0_4_;
  auVar10._8_4_ = local_48._0_4_;
  auVar10._12_4_ = local_48._0_4_;
  auVar5 = vfmadd213ps_fma(auVar10,auVar5,auVar9);
  auVar5 = vhaddps_avx(auVar5,auVar5);
  return auVar5._0_4_ * 0.5 * fVar11;
}

Assistant:

Float Curve::Area() const {
    pstd::array<Point3f, 4> cpObj =
        CubicBezierControlPoints(pstd::MakeConstSpan(common->cpObj), uMin, uMax);
    Float width0 = Lerp(uMin, common->width[0], common->width[1]);
    Float width1 = Lerp(uMax, common->width[0], common->width[1]);
    Float avgWidth = (width0 + width1) * 0.5f;
    Float approxLength = 0.f;
    for (int i = 0; i < 3; ++i)
        approxLength += Distance(cpObj[i], cpObj[i + 1]);
    return approxLength * avgWidth;
}